

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O2

void pinger_write_ping(pinger_t *pinger)

{
  int iVar1;
  uv_write_t *req;
  uint nbufs;
  long lVar2;
  char *base;
  uv_buf_t uVar3;
  code *pcStack_80;
  uv_buf_t local_78 [5];
  
  if (pinger->vectored_writes == 0) {
    pcStack_80 = (code *)0x13c562;
    local_78[0] = uv_buf_init(PING,5);
    nbufs = 1;
  }
  else {
    base = PING;
    nbufs = 5;
    for (lVar2 = 8; lVar2 != 0x58; lVar2 = lVar2 + 0x10) {
      pcStack_80 = (code *)0x13c541;
      uVar3 = uv_buf_init(base,1);
      *(char **)((long)local_78 + lVar2 + -8) = uVar3.base;
      *(size_t *)((long)&local_78[0].base + lVar2) = uVar3.len;
      base = base + 1;
    }
  }
  pcStack_80 = (code *)0x13c578;
  req = (uv_write_t *)malloc(0xc0);
  pcStack_80 = (code *)0x13c593;
  iVar1 = uv_write(req,(uv_stream_t *)&(pinger->stream).tcp,local_78,nbufs,pinger_after_write);
  if (iVar1 == 0) {
    pcStack_80 = (code *)0x13c5a3;
    puts("PING");
    return;
  }
  pcStack_80 = (code *)0x13c5d9;
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ping-pong.c"
          ,0x66,"uv_write failed");
  pcStack_80 = (code *)0x13c5e1;
  fflush(_stderr);
  pcStack_80 = alloc_cb;
  abort();
}

Assistant:

static void pinger_write_ping(pinger_t* pinger) {
  uv_write_t *req;
  uv_buf_t bufs[sizeof PING - 1];
  int i, nbufs;

  if (!pinger->vectored_writes) {
    /* Write a single buffer. */
    nbufs = 1;
    bufs[0] = uv_buf_init(PING, sizeof PING - 1);
  } else {
    /* Write multiple buffers, each with one byte in them. */
    nbufs = sizeof PING - 1;
    for (i = 0; i < nbufs; i++) {
      bufs[i] = uv_buf_init(&PING[i], 1);
    }
  }

  req = malloc(sizeof(*req));
  if (uv_write(req,
               (uv_stream_t*) &pinger->stream.tcp,
               bufs,
               nbufs,
               pinger_after_write)) {
    FATAL("uv_write failed");
  }

  puts("PING");
}